

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_short>
          (TryCast *this,string_t input,uint16_t *result,bool strict)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  idx_t pos;
  long lVar4;
  ulong uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  short sVar9;
  ushort *puVar10;
  uint uVar11;
  ushort uVar12;
  char *pcVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  char cVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  IntegerCastData<short> local_7a;
  ushort *local_78;
  ulong local_70;
  IntegerDecimalCastData<unsigned_short> local_68;
  ulong local_50;
  int local_44;
  string_t input_local;
  
  puVar10 = input.value._8_8_;
  pcVar13 = input.value._0_8_;
  bVar1 = (byte)result;
  pcVar17 = pcVar13;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar17 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = pcVar13;
  uVar18 = (ulong)this & 0xffffffff;
  if (uVar18 != 0) {
    pcVar13 = (char *)0x3;
    uVar15 = 0;
    do {
      bVar2 = pcVar17[uVar15];
      uVar11 = (uint)bVar2;
      if ((4 < uVar11 - 9) && (uVar11 != 0x20)) {
        if (uVar11 == 0x2d) {
          uVar23 = uVar18 - uVar15;
          uVar16 = 1;
          goto LAB_00cda469;
        }
        iVar7 = 3;
        if (bVar2 == 0x30 && uVar18 - 1 != uVar15) {
          cVar19 = pcVar17[uVar15 + 1];
          local_70 = ~uVar15;
          if (cVar19 != 'B') {
            if (cVar19 != 'x') {
              if (cVar19 == 'b') goto LAB_00cda87b;
              if (cVar19 != 'X') {
                if (((byte)(cVar19 - 0x30U) < 10 & bVar1) == 0) goto LAB_00cdaa22;
                goto LAB_00cdaa30;
              }
            }
            local_70 = local_70 + uVar18;
            uVar12 = 0;
            uVar6 = 0;
            uVar16 = 1;
            goto LAB_00cda533;
          }
LAB_00cda87b:
          bVar24 = 1 < local_70 + uVar18;
          if (!bVar24) {
            uVar12 = 0;
            goto LAB_00cda486;
          }
          uVar16 = 1;
          uVar12 = 0;
          goto LAB_00cda899;
        }
LAB_00cdaa22:
        if ((bVar2 == 0x2b & bVar1) != 0) goto LAB_00cdaa30;
        local_78 = (ushort *)(uVar18 - uVar15);
        local_50 = (ulong)(bVar2 == 0x2b);
        uVar11 = 0;
        uVar16 = local_50;
        goto LAB_00cdaa52;
      }
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  uVar12 = (ushort)pcVar13;
  bVar24 = false;
  goto LAB_00cda486;
  while (lVar4 = uVar15 + uVar16, uVar16 = uVar16 + 1, pcVar17[lVar4] == '0') {
LAB_00cda469:
    if (uVar23 <= uVar16) {
      uVar12 = 0;
      uVar16 = 1;
      goto LAB_00cda699;
    }
  }
LAB_00cdaa30:
  uVar12 = 0;
LAB_00cdaa32:
  bVar24 = false;
  goto LAB_00cda486;
  while( true ) {
    uVar20 = uVar16 + 1;
    bVar3 = true;
    if ((~uVar16 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar16] == '_' && bVar1 == 0)) {
      uVar20 = uVar16 + 2;
      if ((uVar18 - uVar16) - 2 == uVar15) {
        bVar3 = false;
      }
      else {
        bVar3 = (byte)(pcVar17[uVar15 + uVar20] - 0x30U) < 10;
      }
    }
    uVar12 = uVar12 * 10 - (ushort)bVar2;
    bVar24 = false;
    uVar16 = uVar20;
    if (!bVar3) break;
LAB_00cda699:
    if (uVar23 <= uVar16) goto LAB_00cdab1e;
    bVar2 = pcVar17[uVar15 + uVar16] - 0x30;
    if (9 < bVar2) {
      if (pcVar17[uVar15 + uVar16] == '.') {
        if (bVar1 != 0) goto LAB_00cdaa32;
        uVar20 = uVar16 + 1;
        if (uVar20 < uVar23) {
          iVar7 = 0;
          if (9 < (byte)(pcVar17[uVar15 + 1 + uVar16] - 0x30U)) goto LAB_00cdb03a;
          iVar8 = 1;
        }
        else {
          iVar7 = 3;
LAB_00cdb03a:
          iVar8 = 1;
          if (1 < uVar16) {
            iVar8 = iVar7;
          }
        }
        uVar16 = uVar20;
        if (iVar8 == 3) goto LAB_00cdab1e;
        if (iVar8 != 0) goto LAB_00cdaa32;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar17[uVar15 + uVar16] < 0x21) &&
         (bVar24 = false, (0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar16] & 0x3f) & 1) != 0)
         ) {
        uVar20 = uVar16 + 1;
        uVar16 = uVar20;
        if (uVar23 <= uVar20) goto LAB_00cdab1e;
        goto LAB_00cdab84;
      }
      break;
    }
  }
  goto LAB_00cda486;
  while (uVar20 = uVar20 + 1, uVar16 = uVar23, uVar23 != uVar20) {
LAB_00cdab84:
    if ((0x20 < (ulong)(byte)pcVar17[uVar15 + uVar20]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar20] & 0x3f) & 1) == 0))
    goto LAB_00cdaa32;
  }
LAB_00cdab1e:
  bVar24 = 1 < uVar16;
  goto LAB_00cda486;
LAB_00cda533:
  do {
    if (local_70 <= uVar16) goto LAB_00cdab1e;
    bVar2 = pcVar17[uVar15 + 1 + uVar16];
    bVar21 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar21 = bVar2;
    }
    if (9 < (byte)(bVar21 - 0x30)) {
      bVar24 = false;
      if ((0x25 < bVar21 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar21 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar19 = -0x57;
    if ((char)bVar21 < 'a') {
      cVar19 = -0x30;
    }
    uVar23 = uVar16 + 1;
    if (((uVar18 - uVar16) - 2 == uVar15) || (pcVar17[uVar15 + 2 + uVar16] != '_')) {
LAB_00cda60e:
      bVar3 = uVar6 <= (ushort)((byte)(cVar19 + bVar21) >> 4 ^ 0xfff);
      if (bVar3) {
        uVar6 = uVar6 * 0x10 + (ushort)(byte)(cVar19 + bVar21);
        uVar12 = uVar6;
      }
    }
    else {
      uVar23 = uVar16 + 2;
      if ((uVar18 - uVar16) - 3 != uVar15) {
        if (9 < (byte)(pcVar17[uVar15 + 3 + uVar16] - 0x30U)) {
          bVar3 = false;
          uVar11 = (byte)pcVar17[uVar15 + 3 + uVar16] - 0x41;
          if ((0x25 < uVar11) || ((0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) == 0))
          goto LAB_00cda63f;
        }
        goto LAB_00cda60e;
      }
      bVar3 = false;
    }
LAB_00cda63f:
    bVar24 = false;
    uVar16 = uVar23;
  } while (bVar3);
  goto LAB_00cda486;
  while( true ) {
    uVar23 = uVar16 + 1;
    if (((uVar18 - uVar16) - 2 != uVar15) && (pcVar17[uVar15 + 2 + uVar16] == '_')) {
      if (((uVar18 - uVar16) - 3 == uVar15) || ((pcVar17[uVar15 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_00cdaa32;
      uVar23 = uVar16 + 2;
    }
    uVar16 = uVar23;
    if ((short)uVar12 < 0) goto LAB_00cdaa32;
    uVar12 = sVar9 + uVar12 * 2;
    bVar24 = true;
    if (local_70 + uVar18 <= uVar16) break;
LAB_00cda899:
    sVar9 = 0;
    bVar24 = false;
    if (pcVar17[uVar15 + 1 + uVar16] != '0') {
      if (pcVar17[uVar15 + 1 + uVar16] != '1') break;
      sVar9 = 1;
    }
  }
  goto LAB_00cda486;
  while( true ) {
    local_70 = uVar16 + 1;
    bVar3 = false;
    uVar23 = local_70;
    if ((uVar11 & 0xffff) <= (bVar2 ^ 0xfffe) / 10) {
      uVar11 = (uVar11 & 0xffff) * 10 + (uint)bVar2;
      bVar3 = true;
      if ((~uVar16 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar16] == '_' && bVar1 == 0)) {
        uVar23 = uVar16 + 2;
        if ((uVar18 - uVar16) - 2 == uVar15) {
          bVar3 = false;
        }
        else {
          bVar3 = (byte)(pcVar17[uVar15 + uVar23] - 0x30U) < 10;
        }
      }
    }
    uVar12 = (ushort)uVar11;
    bVar24 = false;
    uVar16 = uVar23;
    if (!bVar3) break;
LAB_00cdaa52:
    uVar12 = (ushort)uVar11;
    local_44 = iVar7;
    if (local_78 <= uVar16) goto LAB_00cdab2e;
    bVar2 = pcVar17[uVar15 + uVar16] - 0x30;
    if (9 < bVar2) {
      if (pcVar17[uVar15 + uVar16] == '.') {
        if (bVar1 != 0) {
          bVar24 = false;
          break;
        }
        uVar23 = uVar16 + 1;
        if ((uVar23 < local_78) && (local_44 = 0, (byte)(pcVar17[uVar15 + 1 + uVar16] - 0x30U) < 10)
           ) {
          iVar7 = 1;
        }
        else {
          iVar7 = 1;
          if (local_50 < uVar16) {
            iVar7 = local_44;
          }
        }
        uVar16 = uVar23;
        if (iVar7 == 3) goto LAB_00cdab2e;
        if (iVar7 != 0) goto LAB_00cdaa32;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar17[uVar15 + uVar16] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar16] & 0x3f) & 1) != 0)) {
        uVar23 = uVar16 + 1;
        uVar16 = uVar23;
        if (local_78 <= uVar23) goto LAB_00cdab2e;
        goto LAB_00cdada2;
      }
      break;
    }
  }
  goto LAB_00cda486;
  while (lVar4 = uVar15 + uVar23, uVar23 = uVar23 + 1, pcVar17[lVar4] == '0') {
LAB_00cda678:
    if (uVar16 <= uVar23) {
      uVar23 = 1;
      local_68.result = 0;
      goto LAB_00cda965;
    }
  }
  goto LAB_00cda4be;
  while( true ) {
    uVar20 = uVar23 + 1;
    if (local_68.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar24 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar2;
      bVar24 = true;
      if ((~uVar23 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar23] == '_' && bVar1 == 0)) {
        uVar20 = uVar23 + 2;
        if ((uVar18 - uVar23) - 2 == uVar15) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar17[uVar15 + uVar20] - 0x30U) < 10;
        }
      }
    }
    uVar23 = uVar20;
    if (!bVar24) break;
LAB_00cda965:
    if (uVar16 <= uVar23) goto LAB_00cdac75;
    bVar2 = pcVar17[uVar15 + uVar23] - 0x30;
    if (9 < bVar2) {
      if (pcVar17[uVar15 + uVar23] != '.') goto LAB_00cdafc1;
      if (bVar1 == 0) {
        uVar20 = uVar23 + 1;
        if (uVar16 <= uVar20) {
          iVar7 = 3;
          uVar22 = uVar20;
          goto LAB_00cdb1e2;
        }
        local_68.decimal = 0;
        uVar5 = uVar20;
        goto LAB_00cdaccd;
      }
      break;
    }
  }
  goto LAB_00cda4bc;
  while (uVar5 = uVar22, uVar22 < uVar16) {
LAB_00cdaccd:
    bVar2 = pcVar17[uVar15 + uVar5] - 0x30;
    local_78 = (ushort *)uVar20;
    if (9 < bVar2) {
      iVar7 = 0;
      goto LAB_00cdb1cb;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar22 = uVar5 + 1;
    if (((~uVar5 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar5] == '_')) &&
       ((uVar22 = uVar5 + 2, (uVar18 - uVar5) - 2 == uVar15 ||
        (9 < (byte)(pcVar17[uVar15 + uVar22] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar8 = 1;
      goto LAB_00cdb1f5;
    }
  }
  iVar7 = 3;
LAB_00cdb1cb:
  local_68._18_6_ = 0;
  uVar22 = uVar5;
LAB_00cdb1e2:
  iVar8 = 1;
  if (uVar20 < uVar22) {
    iVar8 = iVar7;
  }
  if (1 < uVar23) {
    iVar8 = iVar7;
  }
LAB_00cdb1f5:
  uVar23 = uVar22;
  if (iVar8 == 3) {
LAB_00cdac75:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>(&local_68);
    if (bVar24) {
      bVar24 = 1 < uVar23;
      goto LAB_00cda4be;
    }
  }
  else if (iVar8 == 0) {
LAB_00cdafc1:
    bVar2 = pcVar17[uVar15 + uVar23];
    if (bVar2 - 9 < 5) {
LAB_00cdafd5:
      uVar18 = uVar23 + 1;
      uVar23 = uVar18;
      if (uVar18 < uVar16) {
        do {
          if ((0x20 < (ulong)(byte)pcVar17[uVar15 + uVar18]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar18] & 0x3f) & 1) == 0))
          goto LAB_00cda4bc;
          uVar18 = uVar18 + 1;
          uVar23 = uVar16;
        } while (uVar16 != uVar18);
      }
      goto LAB_00cdac75;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar23 != 1 && bVar1 == 0) && (uVar23 + 1 < uVar16)) {
        local_7a.result = 0;
        pcVar17 = pcVar17 + uVar15 + uVar23 + 1;
        iVar14 = ~uVar15 + (uVar18 - uVar23);
        if (*pcVar17 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar17,iVar14,&local_7a,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar17,iVar14,&local_7a,false);
        }
        bVar24 = false;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                             (&local_68,local_7a.result);
        }
        goto LAB_00cda4be;
      }
    }
    else if (bVar2 == 0x20) goto LAB_00cdafd5;
  }
  goto LAB_00cda4bc;
  while( true ) {
    uVar23 = uVar5;
    if (0x3fffffffffffffff < local_68.result) goto LAB_00cda4bc;
    local_68.result = uVar20 + local_68.result * 2;
    if (uVar16 <= uVar23) break;
LAB_00cdabd8:
    if (pcVar17[uVar15 + 1 + uVar23] == '0') {
      uVar20 = 0;
    }
    else {
      uVar20 = 1;
      if (pcVar17[uVar15 + 1 + uVar23] != '1') goto LAB_00cda4bc;
    }
    uVar5 = uVar23 + 1;
    if (((uVar18 - uVar23) - 2 != uVar15) && (pcVar17[uVar15 + 2 + uVar23] == '_')) {
      if (((uVar18 - uVar23) - 3 == uVar15) || ((pcVar17[uVar15 + 3 + uVar23] & 0xfeU) != 0x30))
      goto LAB_00cda4bc;
      uVar5 = uVar23 + 2;
    }
  }
LAB_00cdac52:
  bVar24 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
  bVar24 = bVar24 && 1 < uVar16;
  goto LAB_00cda4be;
LAB_00cda775:
  do {
    if (~uVar15 + uVar18 <= uVar16) {
      bVar24 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
      bVar24 = 1 < uVar16 && bVar24;
      goto LAB_00cda4be;
    }
    bVar1 = pcVar17[uVar15 + 1 + uVar16];
    bVar2 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar2 = bVar1;
    }
    if ((9 < (byte)(bVar2 - 0x30)) &&
       ((0x25 < bVar2 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar19 = -0x57;
    if ((char)bVar2 < 'a') {
      cVar19 = -0x30;
    }
    uVar23 = uVar16 + 1;
    if (((uVar18 - uVar16) - 2 == uVar15) || (pcVar17[uVar15 + 2 + uVar16] != '_')) {
LAB_00cda841:
      uVar16 = (ulong)((byte)(cVar19 + bVar2) >> 4) ^ 0x7ffffffffffffff;
      lVar4 = local_68.result;
      if (local_68.result <= (long)uVar16) {
        lVar4 = local_68.result * 0x10 + (ulong)(byte)(cVar19 + bVar2);
      }
      bVar24 = local_68.result <= (long)uVar16;
      local_68.result = lVar4;
    }
    else {
      uVar23 = uVar16 + 2;
      if ((uVar18 - uVar16) - 3 != uVar15) {
        if (9 < (byte)(pcVar17[uVar15 + 3 + uVar16] - 0x30U)) {
          uVar11 = (byte)pcVar17[uVar15 + 3 + uVar16] - 0x41;
          bVar24 = false;
          if ((0x25 < uVar11) ||
             (bVar24 = false, (0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) == 0))
          goto LAB_00cda868;
        }
        goto LAB_00cda841;
      }
      bVar24 = false;
    }
LAB_00cda868:
    uVar16 = uVar23;
  } while (bVar24);
  goto LAB_00cda4bc;
  while( true ) {
    bVar2 = pcVar17[uVar15 + uVar23] - 0x30;
    if (9 < bVar2) {
      if (pcVar17[uVar15 + uVar23] != '.') goto LAB_00cdb09c;
      if (bVar1 != 0) goto LAB_00cda4bc;
      uVar20 = uVar23 + 1;
      if (uVar16 <= uVar20) {
        iVar7 = 3;
        uVar22 = uVar20;
        goto LAB_00cdb220;
      }
      local_68.decimal = 0;
      uVar5 = uVar20;
      goto LAB_00cdaf2d;
    }
    uVar20 = uVar23 + 1;
    bVar24 = false;
    if (local_68.result <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar2;
      bVar24 = true;
      if ((~uVar23 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar23] == '_' && bVar1 == 0)) {
        uVar20 = uVar23 + 2;
        if ((uVar18 - uVar23) - 2 == uVar15) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar17[uVar15 + uVar20] - 0x30U) < 10;
        }
      }
    }
    uVar23 = uVar20;
    if (!bVar24) break;
LAB_00cdae0b:
    local_78 = puVar10;
    if (uVar16 <= uVar23) goto LAB_00cdaed4;
  }
  goto LAB_00cdb24d;
  while (uVar5 = uVar22, uVar22 < uVar16) {
LAB_00cdaf2d:
    bVar2 = pcVar17[uVar15 + uVar5] - 0x30;
    if (9 < bVar2) {
      iVar7 = 0;
      goto LAB_00cdb211;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar22 = uVar5 + 1;
    if (((~uVar5 + uVar18 != uVar15) && (pcVar17[uVar15 + 1 + uVar5] == '_')) &&
       ((uVar22 = uVar5 + 2, (uVar18 - uVar5) - 2 == uVar15 ||
        (9 < (byte)(pcVar17[uVar15 + uVar22] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar8 = 1;
      goto LAB_00cdb23c;
    }
  }
  iVar7 = 3;
LAB_00cdb211:
  local_68._18_6_ = 0;
  uVar22 = uVar5;
LAB_00cdb220:
  iVar8 = 1;
  if (uVar20 < uVar22) {
    iVar8 = iVar7;
  }
  if (local_50 < uVar23) {
    iVar8 = iVar7;
  }
LAB_00cdb23c:
  uVar23 = uVar22;
  if (iVar8 == 3) {
LAB_00cdaed4:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
    if (bVar24) {
      bVar24 = local_50 < uVar23;
      puVar10 = local_78;
      goto LAB_00cda4be;
    }
  }
  else if (iVar8 == 0) {
LAB_00cdb09c:
    bVar2 = pcVar17[uVar15 + uVar23];
    if (bVar2 - 9 < 5) {
LAB_00cdb0ac:
      uVar18 = uVar23 + 1;
      uVar23 = uVar18;
      if (uVar18 < uVar16) {
        do {
          if ((0x20 < (ulong)(byte)pcVar17[uVar15 + uVar18]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar18] & 0x3f) & 1) == 0))
          goto LAB_00cdb24d;
          uVar18 = uVar18 + 1;
          uVar23 = uVar16;
        } while (uVar16 != uVar18);
      }
      goto LAB_00cdaed4;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar23 != local_50 && bVar1 == 0) && (uVar23 + 1 < uVar16)) {
        local_7a.result = 0;
        pcVar17 = pcVar17 + uVar15 + uVar23 + 1;
        iVar14 = ~uVar15 + (uVar18 - uVar23);
        if (*pcVar17 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar17,iVar14,&local_7a,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar17,iVar14,&local_7a,false);
        }
        bVar24 = false;
        puVar10 = local_78;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                             (&local_68,local_7a.result);
          puVar10 = local_78;
        }
        goto LAB_00cda4be;
      }
    }
    else if (bVar2 == 0x20) goto LAB_00cdb0ac;
  }
LAB_00cdb24d:
  bVar24 = false;
  puVar10 = local_78;
  goto LAB_00cda4be;
  while (uVar23 = uVar23 + 1, uVar16 = (ulong)local_78, local_78 != (ushort *)uVar23) {
LAB_00cdada2:
    if ((0x20 < (ulong)(byte)pcVar17[uVar15 + uVar23]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar17[uVar15 + uVar23] & 0x3f) & 1) == 0))
    goto LAB_00cdaa32;
  }
LAB_00cdab2e:
  bVar24 = local_50 < uVar16;
LAB_00cda486:
  if (bVar24) {
    *puVar10 = uVar12;
    bVar24 = true;
  }
  else {
    if (uVar18 != 0) {
      uVar15 = 0;
      do {
        bVar2 = pcVar17[uVar15];
        if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar16 = uVar18 - uVar15;
          local_68.decimal_digits = 0;
          input_local.value._0_8_ = this;
          if (bVar2 == 0x2d) {
            local_70 = CONCAT44(local_70._4_4_,(int)result);
            bVar24 = false;
            uVar23 = 1;
            goto LAB_00cda678;
          }
          if (bVar2 == 0x30 && uVar18 - 1 != uVar15) {
            cVar19 = pcVar17[uVar15 + 1];
            if (cVar19 == 'B') {
LAB_00cdabb0:
              uVar16 = ~uVar15 + uVar18;
              if (uVar16 < 2) goto LAB_00cdac52;
              local_68.result = 0;
              uVar23 = 1;
              goto LAB_00cdabd8;
            }
            if (cVar19 != 'x') {
              if (cVar19 == 'b') goto LAB_00cdabb0;
              if (cVar19 != 'X') {
                if (((byte)(cVar19 - 0x30U) < 10 & bVar1) == 0) goto LAB_00cdade4;
                break;
              }
            }
            local_68.result = 0;
            uVar16 = 1;
            goto LAB_00cda775;
          }
LAB_00cdade4:
          if ((bVar2 == 0x2b & bVar1) == 0) {
            local_70 = CONCAT44(local_70._4_4_,(int)result);
            local_50 = (ulong)(bVar2 == 0x2b);
            local_68.result = 0;
            uVar23 = local_50;
            goto LAB_00cdae0b;
          }
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
LAB_00cda4bc:
    bVar24 = false;
LAB_00cda4be:
    if (bVar24 != false) {
      *puVar10 = (ushort)local_68.result;
    }
  }
  return bVar24;
}

Assistant:

bool TryCast::Operation(string_t input, uint16_t &result, bool strict) {
	return TrySimpleIntegerCast<uint16_t, false>(input.GetData(), input.GetSize(), result, strict);
}